

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,Descriptor *value_descriptor,string *serialized_value)

{
  bool bVar1;
  int iVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  long *plVar4;
  size_type *psVar5;
  string sub_delimiter;
  DynamicMessageFactory factory;
  string local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  DynamicMessageFactory local_a8;
  MessageLite *this_00;
  
  DynamicMessageFactory::DynamicMessageFactory(&local_a8);
  pMVar3 = DynamicMessageFactory::GetPrototype(&local_a8,value_descriptor);
  if (pMVar3 == (Message *)0x0) {
    bVar1 = false;
    goto LAB_003bdc28;
  }
  iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3,0);
  this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  bVar1 = ConsumeMessageDelimiter(this,&local_128);
  if (bVar1) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    bVar1 = ConsumeMessage(this,(Message *)this_00,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (!bVar1) goto LAB_003bdc05;
    if (this->allow_partial_ == true) {
      bVar1 = true;
      MessageLite::AppendPartialToString(this_00,serialized_value);
    }
    else {
      iVar2 = (*this_00->_vptr_MessageLite[5])(this_00);
      if ((char)iVar2 == '\0') {
        std::operator+(&local_c8,"Value of type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(value_descriptor + 8) + 0x20));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_108.field_2._M_allocated_capacity = *psVar5;
          local_108.field_2._8_8_ = plVar4[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar5;
          local_108._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_108._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        goto LAB_003bdc05;
      }
      bVar1 = true;
      MessageLite::AppendToString(this_00,serialized_value);
    }
  }
  else {
LAB_003bdc05:
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (this_00 != (MessageLite *)0x0) {
    (*this_00->_vptr_MessageLite[1])(this_00);
  }
LAB_003bdc28:
  DynamicMessageFactory::~DynamicMessageFactory(&local_a8);
  return bVar1;
}

Assistant:

bool ConsumeAnyValue(const Descriptor* value_descriptor,
                       std::string* serialized_value) {
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == nullptr) {
      return false;
    }
    std::unique_ptr<Message> value(value_prototype->New());
    std::string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(
            "Value of type \"" + value_descriptor->full_name() +
            "\" stored in google.protobuf.Any has missing required fields");
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }